

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O0

void virtio_read_stats(ixy_device *ixy,device_stats *stats)

{
  ixy_device *__mptr;
  virtio_device *dev;
  device_stats *stats_local;
  ixy_device *ixy_local;
  
  if (stats != (device_stats *)0x0) {
    stats->rx_pkts = (size_t)(ixy[1].tx_batch + stats->rx_pkts);
    stats->tx_pkts = (size_t)(ixy[1].read_stats + stats->tx_pkts);
    stats->rx_bytes = (size_t)(ixy[1].set_promisc + stats->rx_bytes);
    stats->tx_bytes = (size_t)(ixy[1].get_link_speed + stats->tx_bytes);
  }
  ixy[1].get_link_speed = (_func_uint32_t_ixy_device_ptr *)0x0;
  ixy[1].set_promisc = (_func_void_ixy_device_ptr__Bool *)0x0;
  ixy[1].read_stats = (_func_void_ixy_device_ptr_device_stats_ptr *)0x0;
  ixy[1].tx_batch = (_func_uint32_t_ixy_device_ptr_uint16_t_pkt_buf_ptr_ptr_uint32_t *)0x0;
  return;
}

Assistant:

void virtio_read_stats(struct ixy_device* ixy, struct device_stats* stats) {
	struct virtio_device* dev = IXY_TO_VIRTIO(ixy);
	if (stats) {
		stats->rx_pkts += dev->rx_pkts;
		stats->tx_pkts += dev->tx_pkts;
		stats->rx_bytes += dev->rx_bytes;
		stats->tx_bytes += dev->tx_bytes;
	}
	dev->rx_pkts = dev->tx_pkts = dev->rx_bytes = dev->tx_bytes = 0;
}